

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmsnorm_x86_fma.cpp
# Opt level: O0

void ncnn::rmsnorm(float *ptr,float *gamma_ptr,float eps,int elemcount,int elempack)

{
  float fVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int in_ECX;
  int in_EDX;
  float *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar12;
  undefined1 auVar13 [16];
  __m128 _p_8;
  __m256 _p_7;
  int i_2;
  __m128 _gamma_4;
  __m128 _p_6;
  __m256 _gamma_3;
  __m256 _p_5;
  __m128 _gamma_2;
  __m128 _p_4;
  __m256 _gamma_1;
  __m128 _gamma1;
  __m128 _gamma0;
  __m256 _p_3;
  __m256 _gamma;
  __m256 _p_2;
  int i_1;
  __m128 _eps_1;
  __m128 _elemcount_1;
  __m128 _rms1;
  __m128 _rms0;
  __m256 _eps;
  __m256 _elemcount;
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr0;
  float rms;
  __m128 _rms;
  __m256 _rms_avx;
  int size;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  __m128 x32_1;
  __m128 x64_1;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  int local_d04;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  int local_bc4;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  int local_ae4;
  float *local_ae0;
  float local_ad4;
  undefined1 local_ad0 [8];
  undefined8 uStack_ac8;
  undefined1 local_ac0 [8];
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  float *local_a80;
  float *local_a78;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  float local_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  float fStack_77c;
  float fStack_778;
  float local_690;
  float fStack_68c;
  float local_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float local_620;
  float fStack_61c;
  float local_610;
  float fStack_60c;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined4 uStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined4 uStack_504;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined4 uStack_484;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined4 uStack_404;
  float local_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float local_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float local_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_190;
  undefined8 uStack_188;
  
  iVar11 = in_EDX * in_ECX;
  auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
  _local_ac0 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
  auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
  uStack_1d0 = auVar3._0_8_;
  uStack_1c8 = auVar3._8_8_;
  uStack_ab0 = uStack_1d0;
  uStack_aa8 = uStack_1c8;
  _local_ad0 = ZEXT816(0);
  local_ad4 = 0.0;
  local_ae0 = in_RDI;
  for (local_ae4 = 0; local_ae4 + 7 < iVar11; local_ae4 = local_ae4 + 8) {
    local_b20 = (float)*(undefined8 *)local_ae0;
    fStack_b1c = (float)((ulong)*(undefined8 *)local_ae0 >> 0x20);
    fStack_b18 = (float)*(undefined8 *)(local_ae0 + 2);
    fStack_b14 = (float)((ulong)*(undefined8 *)(local_ae0 + 2) >> 0x20);
    fStack_b10 = (float)*(undefined8 *)(local_ae0 + 4);
    fStack_b0c = (float)((ulong)*(undefined8 *)(local_ae0 + 4) >> 0x20);
    fStack_b08 = (float)*(undefined8 *)(local_ae0 + 6);
    fStack_b04 = (float)((ulong)*(undefined8 *)(local_ae0 + 6) >> 0x20);
    local_8c0 = local_ac0._0_4_;
    fStack_8bc = local_ac0._4_4_;
    fStack_8b8 = local_ac0._8_4_;
    fStack_8b4 = local_ac0._12_4_;
    fStack_8b0 = local_ac0._16_4_;
    fStack_8ac = local_ac0._20_4_;
    fStack_8a8 = local_ac0._24_4_;
    fStack_8a4 = local_ac0._28_4_;
    local_ac0._4_4_ = fStack_b1c * fStack_b1c + fStack_8bc;
    local_ac0._0_4_ = local_b20 * local_b20 + local_8c0;
    uStack_ab8._0_4_ = fStack_b18 * fStack_b18 + fStack_8b8;
    uStack_ab8._4_4_ = fStack_b14 * fStack_b14 + fStack_8b4;
    uStack_ab0._0_4_ = fStack_b10 * fStack_b10 + fStack_8b0;
    uStack_ab0._4_4_ = fStack_b0c * fStack_b0c + fStack_8ac;
    uStack_aa8._0_4_ = fStack_b08 * fStack_b08 + fStack_8a8;
    uStack_aa8._4_4_ = fStack_b04 + fStack_8a4;
    local_ae0 = local_ae0 + 8;
  }
  while( true ) {
    fStack_77c = local_ad0._4_4_;
    fStack_778 = local_ad0._8_4_;
    if (iVar11 <= local_ae4 + 3) break;
    local_2f0 = (float)*(undefined8 *)local_ae0;
    fStack_2ec = (float)((ulong)*(undefined8 *)local_ae0 >> 0x20);
    fStack_2e8 = (float)*(undefined8 *)(local_ae0 + 2);
    fStack_2e4 = (float)((ulong)*(undefined8 *)(local_ae0 + 2) >> 0x20);
    local_ad0._4_4_ = fStack_2ec * fStack_2ec + fStack_77c;
    local_ad0._0_4_ = local_2f0 * local_2f0 + (float)local_ad0._0_4_;
    uStack_ac8._0_4_ = fStack_2e8 * fStack_2e8 + fStack_778;
    uStack_ac8._4_4_ = fStack_2e4 * fStack_2e4 + uStack_ac8._4_4_;
    local_ae0 = local_ae0 + 4;
    local_ae4 = local_ae4 + 4;
  }
  for (; local_ae4 < iVar11; local_ae4 = local_ae4 + 1) {
    local_ad4 = *local_ae0 * *local_ae0 + local_ad4;
    local_ae0 = local_ae0 + 1;
  }
  if (in_ECX == 8) {
    fVar12 = (float)in_EDX;
    auVar3 = vinsertps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar12),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar12),0x30);
    auVar4 = vinsertps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar12),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar12),0x30);
    uStack_190 = auVar4._0_8_;
    uStack_188 = auVar4._8_8_;
    auVar4 = vinsertps_avx(ZEXT416((uint)in_XMM0_Da),ZEXT416((uint)in_XMM0_Da),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)in_XMM0_Da),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)in_XMM0_Da),0x30);
    auVar5 = vinsertps_avx(ZEXT416((uint)in_XMM0_Da),ZEXT416((uint)in_XMM0_Da),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)in_XMM0_Da),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)in_XMM0_Da),0x30);
    auVar2._16_8_ = uStack_190;
    auVar2._0_16_ = auVar3;
    auVar2._24_8_ = uStack_188;
    auVar2 = vdivps_avx(_local_ac0,auVar2);
    local_860 = auVar2._0_4_;
    fStack_85c = auVar2._4_4_;
    fStack_858 = auVar2._8_4_;
    fStack_854 = auVar2._12_4_;
    fStack_850 = auVar2._16_4_;
    fStack_84c = auVar2._20_4_;
    fStack_848 = auVar2._24_4_;
    fStack_844 = auVar2._28_4_;
    local_880 = auVar5._0_4_;
    fStack_87c = auVar5._4_4_;
    fStack_878 = auVar5._8_4_;
    fStack_874 = auVar5._12_4_;
    fStack_870 = auVar4._0_4_;
    fStack_86c = auVar4._4_4_;
    fStack_868 = auVar4._8_4_;
    fStack_864 = auVar4._12_4_;
    local_ac0._4_4_ = fStack_85c + fStack_87c;
    local_ac0._0_4_ = local_860 + local_880;
    uStack_ab8._0_4_ = fStack_858 + fStack_878;
    uStack_ab8._4_4_ = fStack_854 + fStack_874;
    uStack_ab0._0_4_ = fStack_850 + fStack_870;
    uStack_ab0._4_4_ = fStack_84c + fStack_86c;
    uStack_aa8._0_4_ = fStack_848 + fStack_868;
    uStack_aa8._4_4_ = fStack_844 + fStack_864;
    auVar2 = _local_ac0;
    uStack_aa8 = auVar2._24_8_;
    auVar6._16_8_ = uStack_ab0;
    auVar6._0_16_ = _local_ac0;
    auVar6._24_8_ = uStack_aa8;
    _local_ac0 = vrsqrtps_avx(auVar6);
  }
  if (in_ECX == 4) {
    local_790 = local_ac0._16_4_;
    fStack_78c = local_ac0._20_4_;
    fStack_788 = local_ac0._24_4_;
    fStack_784 = local_ac0._28_4_;
    local_7b0 = (float)local_ba0;
    fStack_7ac = (float)((ulong)local_ba0 >> 0x20);
    fStack_7a8 = (float)uStack_b98;
    fStack_7a4 = (float)((ulong)uStack_b98 >> 0x20);
    local_ad0._4_4_ = fStack_77c + fStack_78c + fStack_7ac;
    local_ad0._0_4_ = (float)local_ad0._0_4_ + local_790 + local_7b0;
    uStack_ac8._0_4_ = fStack_778 + fStack_788 + fStack_7a8;
    uStack_ac8._4_4_ = uStack_ac8._4_4_ + fStack_784 + fStack_7a4;
    fVar12 = (float)in_EDX;
    auVar3._4_4_ = fVar12;
    auVar3._0_4_ = fVar12;
    auVar3._12_4_ = fVar12;
    auVar3._8_4_ = fVar12;
    auVar4._8_8_ = uStack_ac8;
    auVar4._0_8_ = local_ad0;
    auVar3 = vdivps_avx(auVar4,auVar3);
    local_7c0 = auVar3._0_4_;
    fStack_7bc = auVar3._4_4_;
    fStack_7b8 = auVar3._8_4_;
    fStack_7b4 = auVar3._12_4_;
    local_ad0._4_4_ = fStack_7bc + in_XMM0_Da;
    local_ad0._0_4_ = local_7c0 + in_XMM0_Da;
    uStack_ac8._0_4_ = fStack_7b8 + in_XMM0_Da;
    uStack_ac8._4_4_ = fStack_7b4 + in_XMM0_Da;
    auVar5._8_8_ = uStack_ac8;
    auVar5._0_8_ = local_ad0;
    _local_ad0 = vrsqrtps_avx(auVar5);
    uStack_ab0 = local_ad0;
    _local_ac0 = _local_ad0;
    uStack_aa8 = uStack_ac8;
  }
  if (in_ECX == 1) {
    local_660 = local_ac0._16_4_;
    fStack_65c = local_ac0._20_4_;
    fStack_658 = local_ac0._24_4_;
    fStack_654 = local_ac0._28_4_;
    local_670 = local_ac0._0_4_;
    fStack_66c = local_ac0._4_4_;
    fStack_668 = local_ac0._8_4_;
    fStack_664 = local_ac0._12_4_;
    uVar7 = CONCAT44(fStack_65c + fStack_66c,local_660 + local_670);
    uVar8 = CONCAT44(fStack_654 + fStack_664,fStack_658 + fStack_668);
    auVar10._8_8_ = uVar8;
    auVar10._0_8_ = uVar7;
    auVar9._8_8_ = uVar8;
    auVar9._0_8_ = uVar7;
    auVar3 = vunpckhpd_avx(auVar9,auVar10);
    local_690 = auVar3._0_4_;
    fStack_68c = auVar3._4_4_;
    auVar3 = vunpckhpd_avx(_local_ad0,_local_ad0);
    local_610 = local_ad0._0_4_;
    fStack_60c = local_ad0._4_4_;
    local_620 = auVar3._0_4_;
    fStack_61c = auVar3._4_4_;
    auVar13._0_4_ =
         (local_ad4 + local_660 + local_670 + local_690 + fStack_65c + fStack_66c + fStack_68c +
         local_610 + local_620 + fStack_60c + fStack_61c) / (float)in_EDX;
    auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar3 = vsqrtss_avx(auVar13,ZEXT416((uint)(auVar13._0_4_ + in_XMM0_Da)));
    local_ad4 = 1.0 / auVar3._0_4_;
    local_ad0 = (undefined1  [8])CONCAT44(local_ad4,local_ad4);
    uStack_ac8 = CONCAT44(local_ad4,local_ad4);
    uStack_ab8 = uStack_ac8;
    local_ac0 = local_ad0;
    uStack_ab0 = local_ad0;
    uStack_aa8 = uStack_ac8;
  }
  local_540 = local_ac0._0_4_;
  fStack_53c = local_ac0._4_4_;
  fStack_538 = local_ac0._8_4_;
  fStack_534 = local_ac0._12_4_;
  fStack_530 = local_ac0._16_4_;
  fStack_52c = local_ac0._20_4_;
  fStack_528 = local_ac0._24_4_;
  local_2e0 = local_ad0._0_4_;
  fStack_2dc = local_ad0._4_4_;
  fStack_2d8 = local_ad0._8_4_;
  fStack_2d4 = local_ad0._12_4_;
  local_a78 = in_RDI;
  if (in_RSI == (float *)0x0) {
    for (local_d04 = 0; local_d04 + 7 < iVar11; local_d04 = local_d04 + 8) {
      local_5a0 = (float)*(undefined8 *)local_a78;
      fStack_59c = (float)((ulong)*(undefined8 *)local_a78 >> 0x20);
      fStack_598 = (float)*(undefined8 *)(local_a78 + 2);
      fStack_594 = (float)((ulong)*(undefined8 *)(local_a78 + 2) >> 0x20);
      fStack_590 = (float)*(undefined8 *)(local_a78 + 4);
      fStack_58c = (float)((ulong)*(undefined8 *)(local_a78 + 4) >> 0x20);
      fStack_588 = (float)*(undefined8 *)(local_a78 + 6);
      uStack_584 = (undefined4)((ulong)*(undefined8 *)(local_a78 + 6) >> 0x20);
      local_d40 = CONCAT44(fStack_59c * fStack_53c,local_5a0 * local_540);
      uStack_d38 = CONCAT44(fStack_594 * fStack_534,fStack_598 * fStack_538);
      uStack_d30 = CONCAT44(fStack_58c * fStack_52c,fStack_590 * fStack_530);
      uStack_d28 = CONCAT44(uStack_584,fStack_588 * fStack_528);
      *(undefined8 *)local_a78 = local_d40;
      *(undefined8 *)(local_a78 + 2) = uStack_d38;
      *(undefined8 *)(local_a78 + 4) = uStack_d30;
      *(undefined8 *)(local_a78 + 6) = uStack_d28;
      local_a78 = local_a78 + 8;
    }
    for (; local_d04 + 3 < iVar11; local_d04 = local_d04 + 4) {
      local_2d0 = (float)*(undefined8 *)local_a78;
      fStack_2cc = (float)((ulong)*(undefined8 *)local_a78 >> 0x20);
      fStack_2c8 = (float)*(undefined8 *)(local_a78 + 2);
      fStack_2c4 = (float)((ulong)*(undefined8 *)(local_a78 + 2) >> 0x20);
      local_d50 = CONCAT44(fStack_2cc * fStack_2dc,local_2d0 * local_2e0);
      uStack_d48 = CONCAT44(fStack_2c4 * fStack_2d4,fStack_2c8 * fStack_2d8);
      *(undefined8 *)local_a78 = local_d50;
      *(undefined8 *)(local_a78 + 2) = uStack_d48;
      local_a78 = local_a78 + 4;
    }
    for (; local_d04 < iVar11; local_d04 = local_d04 + 1) {
      *local_a78 = *local_a78 * local_ad4;
      local_a78 = local_a78 + 1;
    }
  }
  else {
    local_bc4 = 0;
    local_a80 = in_RSI;
    if (in_ECX == 8) {
      for (; local_bc4 + 7 < iVar11; local_bc4 = local_bc4 + 8) {
        fVar12 = *local_a80;
        auVar3 = vinsertps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar12),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar12),0x30);
        auVar4 = vinsertps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar12),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar12),0x30);
        local_420 = (float)*(undefined8 *)local_a78;
        fStack_41c = (float)((ulong)*(undefined8 *)local_a78 >> 0x20);
        fStack_418 = (float)*(undefined8 *)(local_a78 + 2);
        fStack_414 = (float)((ulong)*(undefined8 *)(local_a78 + 2) >> 0x20);
        fStack_410 = (float)*(undefined8 *)(local_a78 + 4);
        fStack_40c = (float)((ulong)*(undefined8 *)(local_a78 + 4) >> 0x20);
        fStack_408 = (float)*(undefined8 *)(local_a78 + 6);
        uStack_404 = (undefined4)((ulong)*(undefined8 *)(local_a78 + 6) >> 0x20);
        local_480 = auVar4._0_4_;
        fStack_47c = auVar4._4_4_;
        fStack_478 = auVar4._8_4_;
        fStack_474 = auVar4._12_4_;
        fStack_470 = auVar3._0_4_;
        fStack_46c = auVar3._4_4_;
        fStack_468 = auVar3._8_4_;
        local_c00 = CONCAT44(fStack_41c * fStack_53c * fStack_47c,local_420 * local_540 * local_480)
        ;
        uStack_bf8 = CONCAT44(fStack_414 * fStack_534 * fStack_474,
                              fStack_418 * fStack_538 * fStack_478);
        uStack_bf0 = CONCAT44(fStack_40c * fStack_52c * fStack_46c,
                              fStack_410 * fStack_530 * fStack_470);
        uStack_be8 = CONCAT44(uStack_404,fStack_408 * fStack_528 * fStack_468);
        *(undefined8 *)local_a78 = local_c00;
        *(undefined8 *)(local_a78 + 2) = uStack_bf8;
        *(undefined8 *)(local_a78 + 4) = uStack_bf0;
        *(undefined8 *)(local_a78 + 6) = uStack_be8;
        local_a78 = local_a78 + 8;
        local_a80 = local_a80 + 1;
      }
    }
    if (in_ECX == 4) {
      for (; local_bc4 + 7 < iVar11; local_bc4 = local_bc4 + 8) {
        fVar12 = *local_a80;
        fVar1 = local_a80[1];
        local_4a0 = (float)*(undefined8 *)local_a78;
        fStack_49c = (float)((ulong)*(undefined8 *)local_a78 >> 0x20);
        fStack_498 = (float)*(undefined8 *)(local_a78 + 2);
        fStack_494 = (float)((ulong)*(undefined8 *)(local_a78 + 2) >> 0x20);
        fStack_490 = (float)*(undefined8 *)(local_a78 + 4);
        fStack_48c = (float)((ulong)*(undefined8 *)(local_a78 + 4) >> 0x20);
        fStack_488 = (float)*(undefined8 *)(local_a78 + 6);
        uStack_484 = (undefined4)((ulong)*(undefined8 *)(local_a78 + 6) >> 0x20);
        local_c40 = CONCAT44(fStack_49c * fStack_53c * fVar12,local_4a0 * local_540 * fVar12);
        uStack_c38 = CONCAT44(fStack_494 * fStack_534 * fVar12,fStack_498 * fStack_538 * fVar12);
        uStack_c30 = CONCAT44(fStack_48c * fStack_52c * fVar1,fStack_490 * fStack_530 * fVar1);
        uStack_c28 = CONCAT44(uStack_484,fStack_488 * fStack_528 * fVar1);
        *(undefined8 *)local_a78 = local_c40;
        *(undefined8 *)(local_a78 + 2) = uStack_c38;
        *(undefined8 *)(local_a78 + 4) = uStack_c30;
        *(undefined8 *)(local_a78 + 6) = uStack_c28;
        local_a78 = local_a78 + 8;
        local_a80 = local_a80 + 2;
      }
      for (; local_bc4 + 3 < iVar11; local_bc4 = local_bc4 + 4) {
        fVar12 = *local_a80;
        local_250 = (float)*(undefined8 *)local_a78;
        fStack_24c = (float)((ulong)*(undefined8 *)local_a78 >> 0x20);
        fStack_248 = (float)*(undefined8 *)(local_a78 + 2);
        fStack_244 = (float)((ulong)*(undefined8 *)(local_a78 + 2) >> 0x20);
        local_c90 = CONCAT44(fStack_24c * fStack_2dc * fVar12,local_250 * local_2e0 * fVar12);
        uStack_c88 = CONCAT44(fStack_244 * fStack_2d4 * fVar12,fStack_248 * fStack_2d8 * fVar12);
        *(undefined8 *)local_a78 = local_c90;
        *(undefined8 *)(local_a78 + 2) = uStack_c88;
        local_a78 = local_a78 + 4;
        local_a80 = local_a80 + 1;
      }
    }
    if (in_ECX == 1) {
      for (; local_bc4 + 7 < iVar11; local_bc4 = local_bc4 + 8) {
        local_520 = (float)*(undefined8 *)local_a78;
        fStack_51c = (float)((ulong)*(undefined8 *)local_a78 >> 0x20);
        fStack_518 = (float)*(undefined8 *)(local_a78 + 2);
        fStack_514 = (float)((ulong)*(undefined8 *)(local_a78 + 2) >> 0x20);
        fStack_510 = (float)*(undefined8 *)(local_a78 + 4);
        fStack_50c = (float)((ulong)*(undefined8 *)(local_a78 + 4) >> 0x20);
        fStack_508 = (float)*(undefined8 *)(local_a78 + 6);
        uStack_504 = (undefined4)((ulong)*(undefined8 *)(local_a78 + 6) >> 0x20);
        local_580 = (float)*(undefined8 *)local_a80;
        fStack_57c = (float)((ulong)*(undefined8 *)local_a80 >> 0x20);
        fStack_578 = (float)*(undefined8 *)(local_a80 + 2);
        fStack_574 = (float)((ulong)*(undefined8 *)(local_a80 + 2) >> 0x20);
        fStack_570 = (float)*(undefined8 *)(local_a80 + 4);
        fStack_56c = (float)((ulong)*(undefined8 *)(local_a80 + 4) >> 0x20);
        fStack_568 = (float)*(undefined8 *)(local_a80 + 6);
        local_cc0 = CONCAT44(fStack_51c * fStack_53c * fStack_57c,local_520 * local_540 * local_580)
        ;
        uStack_cb8 = CONCAT44(fStack_514 * fStack_534 * fStack_574,
                              fStack_518 * fStack_538 * fStack_578);
        uStack_cb0 = CONCAT44(fStack_50c * fStack_52c * fStack_56c,
                              fStack_510 * fStack_530 * fStack_570);
        uStack_ca8 = CONCAT44(uStack_504,fStack_508 * fStack_528 * fStack_568);
        *(undefined8 *)local_a78 = local_cc0;
        *(undefined8 *)(local_a78 + 2) = uStack_cb8;
        *(undefined8 *)(local_a78 + 4) = uStack_cb0;
        *(undefined8 *)(local_a78 + 6) = uStack_ca8;
        local_a78 = local_a78 + 8;
        local_a80 = local_a80 + 8;
      }
      for (; local_bc4 + 3 < iVar11; local_bc4 = local_bc4 + 4) {
        local_290 = (float)*(undefined8 *)local_a78;
        fStack_28c = (float)((ulong)*(undefined8 *)local_a78 >> 0x20);
        fStack_288 = (float)*(undefined8 *)(local_a78 + 2);
        fStack_284 = (float)((ulong)*(undefined8 *)(local_a78 + 2) >> 0x20);
        local_2c0 = (float)*(undefined8 *)local_a80;
        fStack_2bc = (float)((ulong)*(undefined8 *)local_a80 >> 0x20);
        fStack_2b8 = (float)*(undefined8 *)(local_a80 + 2);
        fStack_2b4 = (float)((ulong)*(undefined8 *)(local_a80 + 2) >> 0x20);
        local_cf0 = CONCAT44(fStack_28c * fStack_2dc * fStack_2bc,local_290 * local_2e0 * local_2c0)
        ;
        uStack_ce8 = CONCAT44(fStack_284 * fStack_2d4 * fStack_2b4,
                              fStack_288 * fStack_2d8 * fStack_2b8);
        *(undefined8 *)local_a78 = local_cf0;
        *(undefined8 *)(local_a78 + 2) = uStack_ce8;
        local_a78 = local_a78 + 4;
        local_a80 = local_a80 + 4;
      }
    }
    for (; local_bc4 < iVar11; local_bc4 = local_bc4 + 1) {
      *local_a78 = *local_a78 * local_ad4 * *local_a80;
      local_a78 = local_a78 + 1;
      local_a80 = local_a80 + 1;
    }
  }
  return;
}

Assistant:

static void rmsnorm(float* ptr, const float* gamma_ptr, float eps, int elemcount, int elempack)
{
    const int size = elemcount * elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _rms_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _rms_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _rms = _mm_set1_ps(0.f);
#endif // __SSE2__
    float rms = 0.f;
    {
        const float* ptr0 = ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr0);
            _rms_avx512 = _mm512_fmadd_ps(_p, _p, _rms_avx512);
            ptr0 += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr0);
            _rms_avx = _mm256_comp_fmadd_ps(_p, _p, _rms_avx);
            ptr0 += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _rms = _mm_comp_fmadd_ps(_p, _p, _rms);
            ptr0 += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            rms += ptr0[0] * ptr0[0];
            ptr0++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512 _elemcount = _mm512_set1_ps((float)elemcount);
        __m512 _eps = _mm512_set1_ps(eps);

        _rms_avx512 = _mm512_div_ps(_rms_avx512, _elemcount);
        _rms_avx512 = _mm512_add_ps(_rms_avx512, _eps);

        __m256 _rms0 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_rms_avx512, 0));
        __m256 _rms1 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_rms_avx512, 1));
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms0), _rms1, 1);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _rms0 = _mm512_castps512_ps256(_rms_avx512);
            __m256 _rms1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_rms_avx512), 1));
            _rms_avx = _mm256_add_ps(_rms_avx, _rms0);
            _rms_avx = _mm256_add_ps(_rms_avx, _rms1);
        }
#endif // __AVX512F__

        __m256 _elemcount = _mm256_set1_ps((float)elemcount);
        __m256 _eps = _mm256_set1_ps(eps);

        _rms_avx = _mm256_div_ps(_rms_avx, _elemcount);
        _rms_avx = _mm256_add_ps(_rms_avx, _eps);

        _rms_avx = _mm256_rsqrt_ps(_rms_avx);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _rms0 = _mm512_castps512_ps256(_rms_avx512);
            __m256 _rms1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_rms_avx512), 1));
            _rms_avx = _mm256_add_ps(_rms_avx, _rms0);
            _rms_avx = _mm256_add_ps(_rms_avx, _rms1);
        }
#endif // __AVX512F__
        {
            __m128 _rms0 = _mm256_castps256_ps128(_rms_avx);
            __m128 _rms1 = _mm256_extractf128_ps(_rms_avx, 1);
            _rms = _mm_add_ps(_rms, _rms0);
            _rms = _mm_add_ps(_rms, _rms1);
        }
#endif // __AVX__

        __m128 _elemcount = _mm_set1_ps((float)elemcount);
        __m128 _eps = _mm_set1_ps(eps);

        _rms = _mm_div_ps(_rms, _elemcount);
        _rms = _mm_add_ps(_rms, _eps);

        _rms = _mm_rsqrt_ps(_rms);
#if __AVX__
        _rms_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_rms), _rms, 1);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        rms += _mm512_comp_reduce_add_ps(_rms_avx512);
#endif // __AVX512F__
        rms += _mm256_reduce_add_ps(_rms_avx);
#endif // __AVX__
        rms += _mm_reduce_add_ps(_rms);
#endif // __SSE2__

        rms = 1.f / sqrtf(rms / elemcount + eps);
#if __SSE2__
        _rms = _mm_set1_ps(rms);
#if __AVX__
        _rms_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_rms), _rms, 1);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

    if (gamma_ptr)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_set1_ps(gamma_ptr[0]);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 1;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m256 _gamma0 = _mm256_set1_ps(gamma_ptr[0]);
                __m256 _gamma1 = _mm256_set1_ps(gamma_ptr[1]);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma0), _gamma1, 1);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 2;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_set1_ps(gamma_ptr[0]);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 1;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m128 _gamma2 = _mm_set1_ps(gamma_ptr[2]);
                __m128 _gamma3 = _mm_set1_ps(gamma_ptr[3]);
                __m256 _gamma01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                __m256 _gamma23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma2), _gamma3, 1);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma01), _gamma23, 1);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 4;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m256 _gamma = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 2;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_set1_ps(gamma_ptr[0]);
                _p = _mm_mul_ps(_p, _rms);
                _p = _mm_mul_ps(_p, _gamma);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 1;
            }
        }
        if (elempack == 1)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_loadu_ps(gamma_ptr);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_loadu_ps(gamma_ptr);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_loadu_ps(gamma_ptr);
                _p = _mm_mul_ps(_p, _rms);
                _p = _mm_mul_ps(_p, _gamma);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 4;
            }
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = (ptr[0] * rms) * gamma_ptr[0];
            ptr++;
            gamma_ptr++;
        }
    }
    else
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_mul_ps(_p, _rms_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_mul_ps(_p, _rms_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_mul_ps(_p, _rms);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = ptr[0] * rms;
            ptr++;
        }
    }
}